

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  Logger *this_00;
  string *in_RSI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  size_t i;
  RuneStrArray runes;
  RuneStrArray *in_stack_fffffffffffffa98;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffaa0;
  value_type *in_stack_fffffffffffffaa8;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffab0;
  Logger *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffb2c;
  int lineno;
  char *in_stack_fffffffffffffb30;
  size_t in_stack_fffffffffffffb38;
  Logger *in_stack_fffffffffffffb40;
  Logger local_4b0;
  _Node_iterator_base<unsigned_int,_false> local_330;
  byte local_328;
  _Node_iterator_base<unsigned_int,_false> local_320;
  byte local_318;
  ulong local_310;
  undefined4 local_304;
  Logger local_300;
  LocalVector<cppjieba::RuneStr> local_170;
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)0x13bbd0);
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(in_stack_fffffffffffffab0);
  bVar2 = DecodeRunesInString((string *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  lineno = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb2c);
  if (bVar2) {
    local_310 = 0;
    while( true ) {
      uVar1 = local_310;
      sVar4 = limonp::LocalVector<cppjieba::RuneStr>::size(&local_170);
      if (sVar4 <= uVar1) break;
      limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_170,local_310);
      pVar5 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      local_330._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_328 = pVar5.second;
      local_320._M_cur = local_330._M_cur;
      local_318 = local_328;
      if (((local_328 ^ 0xff) & 1) != 0) {
        limonp::Logger::Logger
                  (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   lineno);
        poVar3 = limonp::Logger::Stream(&local_4b0);
        this_00 = (Logger *)limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_170,local_310)
        ;
        limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_170,local_310);
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffb30,(ulong)local_18);
        in_stack_fffffffffffffaa0 =
             (LocalVector<cppjieba::RuneStr> *)
             std::operator<<(poVar3,(string *)&stack0xfffffffffffffb30);
        std::operator<<((ostream *)in_stack_fffffffffffffaa0," already exists");
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb30);
        limonp::Logger::~Logger(this_00);
        local_1 = 0;
        goto LAB_0013bf37;
      }
      local_310 = local_310 + 1;
    }
    local_1 = 1;
  }
  else {
    limonp::Logger::Logger
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,lineno)
    ;
    poVar3 = limonp::Logger::Stream(&local_300);
    poVar3 = std::operator<<(poVar3,"decode ");
    poVar3 = std::operator<<(poVar3,local_18);
    std::operator<<(poVar3," failed");
    limonp::Logger::~Logger(in_stack_fffffffffffffac0);
    local_1 = 0;
  }
LAB_0013bf37:
  local_304 = 1;
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(in_stack_fffffffffffffaa0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }